

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counter.cpp
# Opt level: O3

uint32_t __thiscall Counter::Read(Counter *this,shared_ptr<myvk::CommandPool> *command_pool)

{
  enable_shared_from_this<myvk::Base> *peVar1;
  shared_ptr<myvk::Fence> *fence;
  uint32_t uVar2;
  _func_int **this_00;
  uint32_t *puVar3;
  initializer_list<VkBufferCopy> __l;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  allocator_type local_81;
  CommandBuffer local_80;
  vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> local_50;
  VkBufferCopy local_38;
  
  myvk::CommandBuffer::Create(&local_80,command_pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  myvk::CommandBuffer::Begin
            ((CommandBuffer *)local_80.super_DeviceObjectBase.super_Base._vptr_Base,1);
  this_00 = local_80.super_DeviceObjectBase.super_Base._vptr_Base;
  local_80.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80.m_command_buffer =
       (VkCommandBuffer)
       (this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer)->_M_use_count
           + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer)->_M_use_count
           + 1;
    }
  }
  local_80.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->m_staging_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (this->m_staging_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (local_80.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      peVar1 = &((local_80.m_command_pool_ptr.
                  super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
      UNLOCK();
    }
    else {
      peVar1 = &((local_80.m_command_pool_ptr.
                  super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr =
           *(int *)&(peVar1->_M_weak_this).super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1;
    }
  }
  local_38.srcOffset = 0;
  local_38.dstOffset = 0;
  local_38.size = 4;
  __l._M_len = 1;
  __l._M_array = &local_38;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector(&local_50,__l,&local_81);
  myvk::CommandBuffer::CmdCopy
            ((CommandBuffer *)this_00,
             (Ptr<BufferBase> *)
             &local_80.m_command_pool_ptr.
              super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Ptr<BufferBase> *)
             ((long)&local_80.super_DeviceObjectBase.super_Base.
                     super_enable_shared_from_this<myvk::Base>._M_weak_this.
                     super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2> + 8),&local_50);
  if (local_50.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_80.m_command_pool_ptr.
               super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.m_command_buffer);
  }
  myvk::CommandBuffer::End((CommandBuffer *)local_80.super_DeviceObjectBase.super_Base._vptr_Base);
  fence = &this->m_fence;
  myvk::CommandBuffer::Submit
            ((CommandBuffer *)local_80.super_DeviceObjectBase.super_Base._vptr_Base,fence);
  myvk::Fence::Wait((fence->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                    0xffffffffffffffff);
  myvk::Fence::Reset((fence->super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  puVar3 = (uint32_t *)
           myvk::Buffer::Map((this->m_staging_buffer).
                             super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  uVar2 = *puVar3;
  myvk::Buffer::Unmap((this->m_staging_buffer).
                      super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (local_80.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_80.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return uVar2;
}

Assistant:

uint32_t Counter::Read(const std::shared_ptr<myvk::CommandPool> &command_pool) const {
	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdCopy(m_buffer, m_staging_buffer, {{0, 0, sizeof(uint32_t)}});
	command_buffer->End();
	command_buffer->Submit(m_fence);
	m_fence->Wait();
	m_fence->Reset();
	uint32_t ret = *((uint32_t *)m_staging_buffer->Map());
	m_staging_buffer->Unmap();
	return ret;
}